

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

void __thiscall QTextCursor::insertHtml(QTextCursor *this,QString *html)

{
  QTextCursorPrivate *pQVar1;
  long in_FS_OFFSET;
  QTextDocumentFragment fragment;
  QTextDocumentFragment local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
    }
    pQVar1 = (this->d).d.ptr;
    if (pQVar1->priv != (QTextDocumentPrivate *)0x0) {
      local_28.d = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      QTextDocumentFragment::fromHtml
                (&local_28,html,*(QTextDocument **)&((this->d).d.ptr)->priv->field_0x8);
      insertFragment(this,&local_28);
      QTextDocumentFragment::~QTextDocumentFragment(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertHtml(const QString &html)
{
    if (!d || !d->priv)
        return;
    QTextDocumentFragment fragment = QTextDocumentFragment::fromHtml(html, d->priv->document());
    insertFragment(fragment);
}